

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream-test.cc
# Opt level: O1

void __thiscall OStreamTest_Print_Test::~OStreamTest_Print_Test(OStreamTest_Print_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(OStreamTest, Print) {
  std::ostringstream os;
  fmt::print(os, "Don't {}!", "panic");
  EXPECT_EQ("Don't panic!", os.str());
  std::wostringstream wos;
  fmt::print(wos, L"Don't {}!", L"panic");
  EXPECT_EQ(L"Don't panic!", wos.str());
}